

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O2

StringTree * __thiscall
kj::strTree<char_const(&)[3],kj::Array<kj::StringTree>,char_const(&)[2]>
          (StringTree *__return_storage_ptr__,kj *this,char (*params) [3],
          Array<kj::StringTree> *params_1,char (*params_2) [2])

{
  ArrayPtr<const_char> local_70;
  StringTree local_60;
  ArrayPtr<const_char> local_28;
  
  local_70 = toCharSequence<char_const(&)[3]>((char (*) [3])this);
  operator*(&local_60,params);
  local_28 = toCharSequence<char_const(&)[2]>((char (*) [2])params_1);
  StringTree::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(StringTree *)&local_70,(ArrayPtr<const_char> *)&local_60,
             (StringTree *)&local_28,(ArrayPtr<const_char> *)params_2);
  StringTree::~StringTree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

StringTree strTree(Params&&... params) {
  return StringTree::concat(_::toStringTreeOrCharSequence(kj::fwd<Params>(params))...);
}